

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::SingleVertexArrayOutputTypeGroup
          (SingleVertexArrayOutputTypeGroup *this,Context *context,InputType type)

{
  _Alloc_hider name;
  InputType type_00;
  string local_60;
  string local_40;
  
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_40,(Array *)(ulong)type,type);
  name._M_p = local_40._M_dataplus._M_p;
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_60,(Array *)(ulong)type,type_00);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,name._M_p,local_60._M_dataplus._M_p);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1b770;
  (this->super_TestCaseGroup).m_context = context;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleVertexArrayOutputTypeGroup_00d269f8;
  this->m_type = type;
  return;
}

Assistant:

SingleVertexArrayOutputTypeGroup::SingleVertexArrayOutputTypeGroup (Context& context, Array::InputType type)
	: TestCaseGroup	(context, Array::inputTypeToString(type).c_str(), Array::inputTypeToString(type).c_str())
	, m_type		(type)
{
}